

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O0

Container *
env_container_get(Container *__return_storage_ptr__,char *identifer,int line,Environment *env)

{
  Record *pRVar1;
  Record *match;
  Environment *env_local;
  int line_local;
  char *identifer_local;
  
  pRVar1 = env_match(identifer,env);
  if (pRVar1 == (Record *)0x0) {
    printf("\x1b[31m\n[Runtime Error] [Line:%d] Container %s is not defined!\x1b[0m",
           (ulong)(uint)line,identifer);
    stop();
  }
  else if ((pRVar1->object).type != OBJECT_CONTAINER) {
    printf("\x1b[31m\n[Runtime Error] [Line:%d] %s is not a container!\x1b[0m",(ulong)(uint)line,
           identifer);
    stop();
  }
  memcpy(__return_storage_ptr__,&(pRVar1->object).field_1,0x30);
  return __return_storage_ptr__;
}

Assistant:

Container env_container_get(char *identifer, int line, Environment *env){
    Record *match = env_match(identifer, env);
    if(match == NULL){
        printf(runtime_error("Container %s is not defined!"), line, identifer);
        stop();
    }
    else if(match->object.type != OBJECT_CONTAINER){
        printf(runtime_error("%s is not a container!"), line, identifer);
        stop();
    }
    return match->object.container;
}